

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

uint64_t getVoronoiSHA(uint64_t seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint auStack_168 [9];
  int aiStack_144 [5];
  uint auStack_130 [66];
  
  uVar2 = (uint)seed;
  auStack_130[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (uint)(seed >> 0x20);
  auStack_130[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  auStack_130[4] = 0x80000000;
  auStack_130[5] = 0;
  auStack_130[6] = 0;
  auStack_130[7] = 0;
  auStack_130[8] = 0;
  auStack_130[9] = 0;
  auStack_130[10] = 0;
  auStack_130[0xb] = 0;
  auStack_130[0xc] = 0;
  auStack_130[0xd] = 0;
  auStack_130[0xe] = 0;
  auStack_130[0xf] = 0;
  auStack_130[0x10] = 0;
  auStack_130[0x11] = 0x40;
  lVar4 = 0x10;
  do {
    uVar2 = auStack_168[lVar4 + 1];
    uVar14 = auStack_130[lVar4];
    auStack_130[lVar4 + 2] =
         (uVar14 >> 10 ^ (uVar14 << 0xd | uVar14 >> 0x13) ^ (uVar14 << 0xf | uVar14 >> 0x11)) +
         (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7)) +
         auStack_168[lVar4] + aiStack_144[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  lVar4 = 0;
  uVar2 = 0x510e527f;
  uVar14 = 0x9b05688c;
  uVar11 = 0x1f83d9ab;
  uVar1 = 0xbb67ae85;
  uVar3 = 0x6a09e667;
  uVar9 = 0x5be0cd19;
  uVar6 = 0x3c6ef372;
  uVar8 = 0xa54ff53a;
  do {
    uVar13 = uVar6;
    uVar7 = uVar3;
    uVar6 = uVar1;
    uVar12 = uVar11;
    uVar11 = uVar14;
    uVar14 = uVar2;
    iVar10 = ((uVar11 ^ uVar12) & uVar14 ^ uVar12) + uVar9 +
             ((uVar14 << 7 | uVar14 >> 0x19) ^
             (uVar14 << 0x15 | uVar14 >> 0xb) ^ (uVar14 << 0x1a | uVar14 >> 6)) +
             *(int *)((long)getVoronoiSHA::K + lVar4) + *(int *)((long)auStack_130 + lVar4 + 8);
    uVar3 = (uVar13 & uVar6 ^ (uVar13 ^ uVar6) & uVar7) +
            ((uVar7 << 10 | uVar7 >> 0x16) ^
            (uVar7 << 0x13 | uVar7 >> 0xd) ^ (uVar7 << 0x1e | uVar7 >> 2)) + iVar10;
    lVar4 = lVar4 + 4;
    uVar2 = uVar8 + iVar10;
    uVar1 = uVar7;
    uVar9 = uVar12;
    uVar8 = uVar13;
  } while (lVar4 != 0x100);
  uVar3 = uVar3 + 0x6a09e667;
  uVar7 = uVar7 + 0xbb67ae85;
  uVar5 = (ulong)uVar3 << 0x20;
  return uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | ((ulong)uVar7 & 0xff000000) << 8 |
         ((ulong)uVar7 & 0xff0000) << 0x18 | ((ulong)uVar7 & 0xff00) << 0x28 |
         CONCAT44(uVar3,uVar7) << 0x38;
}

Assistant:

uint64_t getVoronoiSHA(uint64_t seed)
{
    static const uint32_t K[64] = {
        0x428a2f98,0x71374491, 0xb5c0fbcf,0xe9b5dba5,
        0x3956c25b,0x59f111f1, 0x923f82a4,0xab1c5ed5,
        0xd807aa98,0x12835b01, 0x243185be,0x550c7dc3,
        0x72be5d74,0x80deb1fe, 0x9bdc06a7,0xc19bf174,
        0xe49b69c1,0xefbe4786, 0x0fc19dc6,0x240ca1cc,
        0x2de92c6f,0x4a7484aa, 0x5cb0a9dc,0x76f988da,
        0x983e5152,0xa831c66d, 0xb00327c8,0xbf597fc7,
        0xc6e00bf3,0xd5a79147, 0x06ca6351,0x14292967,
        0x27b70a85,0x2e1b2138, 0x4d2c6dfc,0x53380d13,
        0x650a7354,0x766a0abb, 0x81c2c92e,0x92722c85,
        0xa2bfe8a1,0xa81a664b, 0xc24b8b70,0xc76c51a3,
        0xd192e819,0xd6990624, 0xf40e3585,0x106aa070,
        0x19a4c116,0x1e376c08, 0x2748774c,0x34b0bcb5,
        0x391c0cb3,0x4ed8aa4a, 0x5b9cca4f,0x682e6ff3,
        0x748f82ee,0x78a5636f, 0x84c87814,0x8cc70208,
        0x90befffa,0xa4506ceb, 0xbef9a3f7,0xc67178f2,
    };
    static const uint32_t B[8] = {
        0x6a09e667,0xbb67ae85, 0x3c6ef372,0xa54ff53a,
        0x510e527f,0x9b05688c, 0x1f83d9ab,0x5be0cd19,
    };

    uint32_t m[64];
    uint32_t a0,a1,a2,a3,a4,a5,a6,a7;
    uint32_t i, x, y;
    m[0] = BSWAP32((uint32_t)(seed));
    m[1] = BSWAP32((uint32_t)(seed >> 32));
    m[2] = 0x80000000;
    for (i = 3; i < 15; i++)
        m[i] = 0;
    m[15] = 0x00000040;

    for (i = 16; i < 64; ++i)
    {
        m[i] = m[i - 7] + m[i - 16];
        x = m[i - 15];
        m[i] += rotr32(x,7) ^ rotr32(x,18) ^ (x >> 3);
        x = m[i - 2];
        m[i] += rotr32(x,17) ^ rotr32(x,19) ^ (x >> 10);
    }

    a0 = B[0];
    a1 = B[1];
    a2 = B[2];
    a3 = B[3];
    a4 = B[4];
    a5 = B[5];
    a6 = B[6];
    a7 = B[7];

    for (i = 0; i < 64; i++)
    {
        x = a7 + K[i] + m[i];
        x += rotr32(a4,6) ^ rotr32(a4,11) ^ rotr32(a4,25);
        x += (a4 & a5) ^ (~a4 & a6);

        y = rotr32(a0,2) ^ rotr32(a0,13) ^ rotr32(a0,22);
        y += (a0 & a1) ^ (a0 & a2) ^ (a1 & a2);

        a7 = a6;
        a6 = a5;
        a5 = a4;
        a4 = a3 + x;
        a3 = a2;
        a2 = a1;
        a1 = a0;
        a0 = x + y;
    }

    a0 += B[0];
    a1 += B[1];

    return BSWAP32(a0) | ((uint64_t)BSWAP32(a1) << 32);
}